

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  long lVar4;
  LinkType lt;
  char *__s;
  allocator<char> local_79;
  string file;
  ItemIsPath local_54;
  void *local_50;
  string generator;
  FeatureDescriptor *local_28;
  
  bVar1 = CheckImplicitDirItem(this,entry);
  if (bVar1) {
    return;
  }
  if ((this->NoSONameUsesPath == true) && (bVar1 = CheckSharedLibNoSOName(this,entry), bVar1)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&generator);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  if ((PVar3 != NEW) &&
     ((lVar4 = std::__cxx11::string::find((char *)&generator,0x69ac49), lVar4 != -1 ||
      (lVar4 = std::__cxx11::string::find((char *)&generator,0x694b12), lVar4 != -1)))) {
    cmsys::SystemTools::GetFilenameName(&file,(string *)entry);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,file._M_dataplus._M_p);
    if (!bVar1) {
      HandleBadFullItem(this,entry,&file);
      std::__cxx11::string::~string((string *)&file);
      goto LAB_00372031;
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenameName(&file,(string *)entry);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,file._M_dataplus._M_p);
    if (bVar1) {
      lt = LinkShared;
LAB_00371f41:
      SetCurrentLinkType(this,lt);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(string *)entry);
      if (!bVar1) {
        lt = this->StartLinkType;
        goto LAB_00371f41;
      }
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if (this->OldLinkDirMode == true) {
    cmsys::SystemTools::GetFilenamePath(&file,(string *)entry);
    bVar1 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&this->OldLinkDirMask,&file);
    std::__cxx11::string::~string((string *)&file);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)entry);
    }
  }
  local_50 = (void *)0x0;
  local_54 = Yes;
  _Var2 = std::operator==(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
  if (_Var2) {
    __s = "__CMAKE_LINK_LIBRARY";
    if (entry->Kind == Object) {
      __s = "__CMAKE_LINK_OBJECT";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&file,__s,&local_79);
  }
  else {
    std::__cxx11::string::string((string *)&file,(string *)&entry->Feature);
  }
  local_28 = FindLibraryFeature(this,&file);
  std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
  emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmSourceFile_const*const&,cmComputeLinkInformation::FeatureDescriptor_const*>
            ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              *)this,&entry->Item,&local_54,&local_50,&entry->ObjectSource,&local_28);
  std::__cxx11::string::~string((string *)&file);
LAB_00372031:
  std::__cxx11::string::~string((string *)&generator);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // Check for the implicit link directory special case.
  if (this->CheckImplicitDirItem(entry)) {
    return;
  }

  // Check for case of shared library with no builtin soname.
  if (this->NoSONameUsesPath && this->CheckSharedLibNoSOName(entry)) {
    return;
  }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if (this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
      (generator.find("Visual Studio") != std::string::npos ||
       generator.find("Xcode") != std::string::npos)) {
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractAnyLibraryName.find(file)) {
      this->HandleBadFullItem(entry, file);
      return;
    }
  }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (this->LinkTypeEnabled) {
    std::string name = cmSystemTools::GetFilenameName(item.Value);
    if (this->ExtractSharedLibraryName.find(name)) {
      this->SetCurrentLinkType(LinkShared);
    } else if (!this->ExtractStaticLibraryName.find(item.Value)) {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
    }
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  // Now add the full path to the library.
  this->Items.emplace_back(
    item, ItemIsPath::Yes, nullptr, entry.ObjectSource,
    this->FindLibraryFeature(
      entry.Feature == DEFAULT
        ? (entry.Kind == cmComputeLinkDepends::LinkEntry::Object
             ? "__CMAKE_LINK_OBJECT"
             : "__CMAKE_LINK_LIBRARY")
        : entry.Feature));
}